

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall Instance::computeCollisionConstraint(Instance *this,Train *train)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference otherTrain_00;
  reference pvVar4;
  Train *in_RSI;
  long in_RDI;
  expr endVar;
  expr startVar;
  size_t betweenIndex;
  Train *otherTrain;
  iterator __end5;
  iterator __begin5;
  vector<Train,_std::allocator<Train>_> *__range5;
  expr_vector otherPathVars;
  size_t time;
  size_t pathIndex;
  size_t endIndex;
  size_t startIndex;
  expr_vector otherTrainPosVars;
  pathType path;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  ast_vector_tpl<z3::expr> *in_stack_fffffffffffffe70;
  reference in_stack_fffffffffffffe78;
  Graph *in_stack_fffffffffffffe80;
  reference in_stack_fffffffffffffe88;
  reference in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  expr_vector *in_stack_fffffffffffffeb8;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *in_stack_fffffffffffffec0;
  size_type local_b8;
  __normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_> local_a0;
  long local_98;
  ulong local_80;
  size_type local_78;
  ulong local_70;
  ulong local_68;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> local_40;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *local_28;
  __normal_iterator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_*,_std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>
  local_20;
  reference local_18;
  Train *local_10;
  
  local_10 = in_RSI;
  local_18 = std::
             vector<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
                           *)(in_RDI + 0x180),(ulong)in_RSI->id);
  local_20._M_current =
       (vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)
       std::
       vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
       ::begin((vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_28 = (vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)
             std::
             vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
             ::end((vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_*,_std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>
                             *)in_stack_fffffffffffffe70,
                            (__normal_iterator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_*,_std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)), bVar2
        ) {
    __gnu_cxx::
    __normal_iterator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_*,_std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>
    ::operator*(&local_20);
    std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::vector
              (in_stack_fffffffffffffec0,
               (vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)in_stack_fffffffffffffeb8);
    z3::ast_vector_tpl<z3::expr>::ast_vector_tpl
              (in_stack_fffffffffffffe70,
               (context *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    for (local_68 = 0; uVar1 = local_68,
        sVar3 = std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::size(&local_40),
        uVar1 < sVar3; local_68 = local_68 + 1) {
      local_70 = Graph::reachableInPath
                           (in_stack_fffffffffffffe80,(pathType *)in_stack_fffffffffffffe78,
                            (size_t)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      for (local_78 = local_68; local_78 <= local_70; local_78 = local_78 + 1) {
        for (local_80 = (ulong)(local_10->start).arrivalTime;
            local_80 < *(int *)(in_RDI + 0x138) - 1; local_80 = local_80 + 1) {
          z3::ast_vector_tpl<z3::expr>::ast_vector_tpl
                    (in_stack_fffffffffffffe70,
                     (context *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          local_98 = in_RDI + 0x120;
          local_a0._M_current =
               (Train *)std::vector<Train,_std::allocator<Train>_>::begin
                                  ((vector<Train,_std::allocator<Train>_> *)
                                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          std::vector<Train,_std::allocator<Train>_>::end
                    ((vector<Train,_std::allocator<Train>_> *)
                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_>
                                     *)in_stack_fffffffffffffe70,
                                    (__normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                                   ), bVar2) {
            otherTrain_00 =
                 __gnu_cxx::__normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_>
                 ::operator*(&local_a0);
            in_stack_fffffffffffffe9f = Train::operator==(local_10,otherTrain_00);
            if ((!(bool)in_stack_fffffffffffffe9f) &&
               ((otherTrain_00->start).arrivalTime <= local_80)) {
              for (local_b8 = local_68; local_b8 <= local_78; local_b8 = local_b8 + 1) {
                pvVar4 = std::
                         vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                         ::operator[]((vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                       *)(in_RDI + 0x158),(ulong)otherTrain_00->id);
                in_stack_fffffffffffffe90 =
                     std::
                     vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                     ::operator[](pvVar4,local_80);
                std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::operator[]
                          (&local_40,local_b8);
                z3::ast_vector_tpl<z3::expr>::operator[]
                          ((ast_vector_tpl<z3::expr> *)
                           CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                           (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
                z3::operator!((expr *)in_stack_fffffffffffffe88);
                z3::ast_vector_tpl<z3::expr>::push_back
                          ((ast_vector_tpl<z3::expr> *)in_stack_fffffffffffffe80,
                           (expr *)in_stack_fffffffffffffe78);
                z3::expr::~expr((expr *)0x105848);
                z3::expr::~expr((expr *)0x105855);
                pvVar4 = std::
                         vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                         ::operator[]((vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                       *)(in_RDI + 0x158),(ulong)otherTrain_00->id);
                in_stack_fffffffffffffe88 =
                     std::
                     vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                     ::operator[](pvVar4,local_80 + 1);
                std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::operator[]
                          (&local_40,local_b8);
                z3::ast_vector_tpl<z3::expr>::operator[]
                          ((ast_vector_tpl<z3::expr> *)
                           CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                           (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
                z3::operator!((expr *)in_stack_fffffffffffffe88);
                z3::ast_vector_tpl<z3::expr>::push_back
                          ((ast_vector_tpl<z3::expr> *)in_stack_fffffffffffffe80,
                           (expr *)in_stack_fffffffffffffe78);
                z3::expr::~expr((expr *)0x1058f3);
                z3::expr::~expr((expr *)0x105900);
              }
            }
            __gnu_cxx::__normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_>::
            operator++(&local_a0);
          }
          pvVar4 = std::
                   vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                   ::operator[]((vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                 *)(in_RDI + 0x158),(ulong)local_10->id);
          in_stack_fffffffffffffe80 =
               (Graph *)std::
                        vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                        ::operator[](pvVar4,local_80);
          std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::operator[](&local_40,local_68);
          z3::ast_vector_tpl<z3::expr>::operator[]
                    ((ast_vector_tpl<z3::expr> *)
                     CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                     (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
          pvVar4 = std::
                   vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                   ::operator[]((vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                 *)(in_RDI + 0x158),(ulong)local_10->id);
          in_stack_fffffffffffffe78 =
               std::
               vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
               ::operator[](pvVar4,local_80 + 1);
          std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::operator[](&local_40,local_78);
          z3::ast_vector_tpl<z3::expr>::operator[]
                    ((ast_vector_tpl<z3::expr> *)
                     CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                     (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
          in_stack_fffffffffffffe70 = (ast_vector_tpl<z3::expr> *)(in_RDI + 0x198);
          z3::operator&&((expr *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                         (expr *)in_stack_fffffffffffffe90);
          z3::mk_and(in_stack_fffffffffffffeb8);
          z3::implies((expr *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                      (expr *)in_stack_fffffffffffffe90);
          std::vector<z3::expr,_std::allocator<z3::expr>_>::push_back
                    ((vector<z3::expr,_std::allocator<z3::expr>_> *)in_stack_fffffffffffffe70,
                     (value_type *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          z3::expr::~expr((expr *)0x105af3);
          z3::expr::~expr((expr *)0x105afd);
          z3::expr::~expr((expr *)0x105b07);
          z3::expr::~expr((expr *)0x105b14);
          z3::expr::~expr((expr *)0x105b21);
          z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl(in_stack_fffffffffffffe70);
        }
      }
    }
    z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl(in_stack_fffffffffffffe70);
    std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::~vector
              ((vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)in_stack_fffffffffffffe80);
    __gnu_cxx::
    __normal_iterator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_*,_std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void Instance::computeCollisionConstraint(const Train &train) {
  for (pathType path : trainPaths[train.id]) {
    expr_vector otherTrainPosVars(*c);
    for (size_t startIndex = 0; startIndex < path.size(); startIndex++) {
      size_t endIndex = graph.reachableInPath(path, startIndex, train.speed);
      for (size_t pathIndex = startIndex; pathIndex <= endIndex; pathIndex++) {

        for (size_t time = train.start.arrivalTime; time < maxTimeSteps - 1;
             time++) {
          expr_vector otherPathVars(*c);

          for (const Train &otherTrain : trains) {
            if (train == otherTrain || otherTrain.start.arrivalTime > time)
              continue;
            for (size_t betweenIndex = startIndex; betweenIndex <= pathIndex;
                 betweenIndex++) {

              otherPathVars.push_back(
                  !occupiedVars[otherTrain.id][time][path[betweenIndex]->id]);
              otherPathVars.push_back(!occupiedVars[otherTrain.id][time + 1]
                                                   [path[betweenIndex]->id]);
            }
          }

          expr startVar = occupiedVars[train.id][time][path[startIndex]->id];
          expr endVar = occupiedVars[train.id][time + 1][path[pathIndex]->id];
          constraints.push_back(
              implies(startVar && endVar, mk_and(otherPathVars)));
        }
      }
    }
  }
}